

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

double __thiscall
ON_NurbsSurface::GetCubicBezierApproximation
          (ON_NurbsSurface *this,double max_deviation,ON_3dPoint (*bezCV) [4])

{
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  double *g_00;
  double *pdVar4;
  double dVar5;
  double t;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  ON_NurbsCurve *this_00;
  ON_3dPoint *pOVar8;
  uint uVar9;
  int side;
  ulong uVar10;
  long lVar11;
  ON_3dPoint *pOVar12;
  int i;
  long lVar13;
  int j;
  int iVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double local_498;
  double local_490;
  double local_478;
  int hint [2];
  ON_3dPoint nurbsP;
  double *g [2];
  double adStack_418 [2];
  ON_3dPoint bezP;
  ON_2dex cvdex [4];
  ON_Interval local_3b8;
  ON_Interval local_3a8;
  double c [4];
  ON_BezierSurface local_378;
  ON_3dPoint srfP [4];
  ON_3dPoint Q [4];
  ON_3dPoint local_280;
  ON_3dPoint local_268;
  ON_3dPoint local_250;
  double g_buffer [64];
  ON_Object *p;
  
  dVar5 = ON_DBL_QNAN;
  local_490 = ON_DBL_QNAN;
  bVar6 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if ((((bVar6) || (this->m_order[0] < 2)) || (this->m_order[1] < 2)) ||
     ((0x40 < this->m_cv_count[0] || this->m_cv_count[0] < this->m_order[0] ||
      (0x40 < this->m_cv_count[1] || this->m_cv_count[1] < this->m_order[1])))) {
    return dVar5;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
  c[0] = ON_Interval::operator[](&local_3a8,0);
  c[1] = ON_Interval::operator[](&local_3b8,1);
  c[2] = ON_Interval::operator[](&local_3a8,1);
  c[3] = ON_Interval::operator[](&local_3b8,0);
  uVar16 = 0;
  uVar17 = 0;
  for (uVar10 = 0; local_478 = (double)CONCAT44(uVar17,uVar16), uVar10 != 4; uVar10 = uVar10 + 1) {
    iVar7 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(c[uVar10],0));
    p = (ON_Object *)CONCAT44(extraout_var,iVar7);
    if (p == (ON_Object *)0x0) {
      return dVar5;
    }
    this_00 = ON_NurbsCurve::Cast(p);
    dVar18 = dVar5;
    if (this_00 != (ON_NurbsCurve *)0x0) {
      pOVar12 = *bezCV;
      if (uVar10 == 1) {
        pOVar12 = bezCV[3];
      }
      if ((uVar10 & 1) == 0) {
        pOVar12 = Q;
      }
      dVar18 = ON_NurbsCurve::GetCubicBezierApproximation(this_00,dVar5,pOVar12);
    }
    if (dVar18 < 0.0) {
      return dVar5;
    }
    if ((uVar10 & 1) == 0) {
      lVar11 = 0x48;
      if (uVar10 == 0) {
        lVar11 = 0;
      }
      *(double *)((long)&bezCV[1][0].z + lVar11) = Q[1].z;
      pdVar1 = (double *)((long)&bezCV[1][0].x + lVar11);
      *pdVar1 = Q[1].x;
      pdVar1[1] = Q[1].y;
      *(double *)((long)&bezCV[2][0].z + lVar11) = Q[2].z;
      puVar2 = (undefined4 *)((long)&bezCV[2][0].x + lVar11);
      *puVar2 = Q[2].x._0_4_;
      puVar2[1] = Q[2].x._4_4_;
      puVar2[2] = Q[2].y._0_4_;
      puVar2[3] = Q[2].y._4_4_;
    }
    if (dVar18 <= local_478) {
      dVar18 = local_478;
    }
    (*p->_vptr_ON_Object[4])(p);
    uVar16 = SUB84(dVar18,0);
    uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
  }
  bezCV[1][1].z = ON_3dPoint::Origin.z;
  dVar5 = ON_3dPoint::Origin.y;
  bezCV[1][1].x = ON_3dPoint::Origin.x;
  bezCV[1][1].y = dVar5;
  bezCV[1][2].z = ON_3dPoint::Origin.z;
  dVar5 = ON_3dPoint::Origin.y;
  bezCV[1][2].x = ON_3dPoint::Origin.x;
  bezCV[1][2].y = dVar5;
  dVar5 = ON_3dPoint::Origin.y;
  bezCV[2][1].x = ON_3dPoint::Origin.x;
  bezCV[2][1].y = dVar5;
  bezCV[2][1].z = ON_3dPoint::Origin.z;
  dVar5 = ON_3dPoint::Origin.y;
  bezCV[2][2].x = ON_3dPoint::Origin.x;
  bezCV[2][2].y = dVar5;
  bezCV[2][2].z = ON_3dPoint::Origin.z;
  ON_BezierSurface::ON_BezierSurface(&local_378);
  local_378.m_dim = 3;
  local_378.m_is_rat = 0;
  local_378.m_order[0] = 4;
  local_378.m_order[1] = 4;
  local_378.m_cv_stride[0] = 0xc;
  local_378.m_cv_stride[1] = 3;
  srfP[0].z = ON_3dPoint::Origin.z;
  srfP[0].x = ON_3dPoint::Origin.x;
  srfP[0].y = ON_3dPoint::Origin.y;
  srfP[1].x = ON_3dPoint::Origin.x;
  srfP[1].y = ON_3dPoint::Origin.y;
  srfP[1].z = ON_3dPoint::Origin.z;
  srfP[2].x = ON_3dPoint::Origin.x;
  srfP[2].y = ON_3dPoint::Origin.y;
  srfP[2].z = ON_3dPoint::Origin.z;
  srfP[3].x = ON_3dPoint::Origin.x;
  srfP[3].y = ON_3dPoint::Origin.y;
  srfP[3].z = ON_3dPoint::Origin.z;
  hint[0] = 0;
  hint[1] = 0;
  local_378.m_cv = (double *)bezCV;
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    dVar5 = ON_Interval::ParameterAt(&local_3b8,(double)(&DAT_006bffd0)[lVar11 * 2]);
    ON_Interval::ParameterAt(&local_3a8,(double)(&DAT_006bffd8)[lVar11 * 2]);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37])
              (SUB84(dVar5,0),this,0,3,srfP + lVar11,0,hint);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)g_buffer,0.0,0.0,0.0);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)cvdex,0.0,0.0,0.0);
    lVar13 = 0;
    pOVar12 = *bezCV;
    for (; lVar13 != 4; lVar13 = lVar13 + 1) {
      pOVar8 = pOVar12;
      for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
        if (1 < ((int)lVar15 - 1U | (int)lVar13 - 1U)) {
          ::operator*(&nurbsP,*(double *)
                               ((long)&DAT_006bff90 + lVar13 * 8 + (ulong)(((uint)lVar11 & 1) << 5))
                              * *(double *)
                                 ((long)&DAT_006bff90 +
                                 lVar15 * 8 + (lVar11 * 0x10 & 0xffffffffffffffe0U)),pOVar8);
          ON_3dVector::ON_3dVector((ON_3dVector *)&bezP,&nurbsP);
          ON_3dPoint::operator+=((ON_3dPoint *)g_buffer,(ON_3dVector *)&bezP);
        }
        pOVar8 = pOVar8 + 1;
      }
      pOVar12 = pOVar12 + 4;
    }
    ::operator*(&nurbsP,2.25,srfP + lVar11);
    ON_3dPoint::operator/((ON_3dPoint *)g,(ON_3dPoint *)g_buffer,324.0);
    ON_3dPoint::operator-((ON_3dVector *)&bezP,&nurbsP,(ON_3dPoint *)g);
    ON_3dPoint::operator=(Q + lVar11,(ON_3dVector *)&bezP);
  }
  ON_2dex::ON_2dex(cvdex,1,1);
  ON_2dex::ON_2dex(cvdex + 1,2,1);
  ON_2dex::ON_2dex(cvdex + 2,1,2);
  ON_2dex::ON_2dex(cvdex + 3,2,2);
  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 8) {
    ::operator*((ON_3dPoint *)g,*(double *)((long)&DAT_006c0010 + lVar11 * 4),Q);
    ::operator*(&local_250,*(double *)((long)&DAT_006c0018 + lVar11 * 4),Q + 1);
    ON_3dPoint::operator+(&nurbsP,(ON_3dPoint *)g,&local_250);
    ::operator*(&local_268,*(double *)((long)&DAT_006c0020 + lVar11 * 4),Q + 2);
    ON_3dPoint::operator+(&bezP,&nurbsP,&local_268);
    ::operator*(&local_280,*(double *)((long)&DAT_006c0028 + lVar11 * 4),Q + 3);
    ON_3dPoint::operator+((ON_3dPoint *)g_buffer,&bezP,&local_280);
    iVar7 = *(int *)((long)&cvdex[0].i + lVar11);
    iVar14 = *(int *)((long)&cvdex[0].j + lVar11);
    bezCV[iVar7][iVar14].z = g_buffer[2];
    bezCV[iVar7][iVar14].x = g_buffer[0];
    bezCV[iVar7][iVar14].y = g_buffer[1];
  }
  local_498 = 0.0;
  pOVar12 = srfP;
  pOVar8 = (ON_3dPoint *)g_buffer;
  for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
    ON_3dPoint::ON_3dPoint(pOVar8,0.0,0.0,0.0);
    ON_BezierSurface::Evaluate
              (&local_378,*(double *)((long)&DAT_006bffd0 + lVar11),
               *(double *)((long)&DAT_006bffd8 + lVar11),0,3,(double *)pOVar8);
    dVar5 = ON_3dPoint::DistanceTo(pOVar12,pOVar8);
    local_498 = local_498 + dVar5;
    pOVar12 = pOVar12 + 1;
  }
  iVar7 = this->m_cv_count[0];
  uVar9 = this->m_cv_count[1] + iVar7;
  if (0x20 < (int)uVar9) {
    pOVar8 = (ON_3dPoint *)onmalloc((ulong)uVar9 << 3);
    iVar7 = this->m_cv_count[0];
  }
  g[0] = &pOVar8->x;
  pdVar1 = &pOVar8->x + iVar7;
  g[1] = pdVar1;
  for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
    g_00 = (double *)adStack_418[lVar11];
    GetGrevilleAbcissae(this,(int)lVar11 + 2,g_00);
    if (this->m_cv_count[lVar11] == 4) {
      pdVar4 = *(double **)(this->m_cv_stride + lVar11 * 2);
      dVar5 = pdVar4[2];
      if (*pdVar4 <= dVar5 && dVar5 != *pdVar4) {
        *g_00 = dVar5;
        g_00[1] = (pdVar4[2] + pdVar4[2] + pdVar4[3]) / 3.0;
      }
      lVar13 = (long)this->m_knot_capacity[lVar11];
      if (pdVar4[lVar13 + -1] < pdVar4[lVar13 + 1]) {
        g_00[lVar13 + -1] = pdVar4[lVar13 + -1];
        g_00[lVar13 + -2] = (pdVar4[lVar13 + -1] + pdVar4[lVar13 + -1] + pdVar4[lVar13 + -2]) / 3.0;
      }
    }
  }
  bezP.z = ON_3dPoint::Origin.z;
  bezP.x = ON_3dPoint::Origin.x;
  bezP.y = ON_3dPoint::Origin.y;
  nurbsP.z = ON_3dPoint::Origin.z;
  nurbsP.x = ON_3dPoint::Origin.x;
  nurbsP.y = ON_3dPoint::Origin.y;
  hint[0] = 0;
  hint[1] = 0;
  lVar11 = 1;
LAB_00551fcf:
  if (this->m_cv_count[0] <= lVar11) {
    local_490 = local_478;
LAB_00552196:
    ON_BezierSurface::~ON_BezierSurface(&local_378);
    return local_490;
  }
  iVar7 = 0;
  do {
    lVar13 = 1;
    if (iVar7 == 0) {
      dVar5 = (*(double *)((long)pOVar8 + lVar11 * 8 + -8) + (&pOVar8->x)[lVar11]) * 0.5;
    }
    else {
      if (iVar7 == 2) break;
      dVar5 = (&pOVar8->x)[lVar11];
    }
    dVar18 = ON_Interval::NormalizedParameterAt(&local_3b8,dVar5);
    if ((0.0 < dVar18) && (dVar18 < 1.0)) {
LAB_00552060:
      if (lVar13 < this->m_cv_count[1]) {
        iVar14 = 0;
        do {
          if (iVar14 == 0) {
            dVar3 = (pdVar1[lVar13 + -1] + pdVar1[lVar13]) * 0.5;
          }
          else {
            if (iVar14 == 2) goto LAB_00552164;
            dVar3 = pdVar1[lVar13];
          }
          t = ON_Interval::NormalizedParameterAt(&local_3a8,dVar3);
          if ((0.0 < t) && (t < 1.0)) {
            ON_BezierSurface::Evaluate(&local_378,dVar18,t,0,3,&bezP.x);
            (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37])
                      (SUB84(dVar5,0),dVar3,this,0,3,&nurbsP,0,hint);
            dVar3 = ON_3dPoint::DistanceTo(&nurbsP,&bezP);
            if ((local_498 * 16.0 < dVar3) &&
               (((local_478 < dVar3 && (local_478 = dVar3, 0.0 <= max_deviation)) &&
                (max_deviation < dVar3)))) goto LAB_00552196;
          }
          iVar14 = iVar14 + 1;
        } while( true );
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
  lVar11 = lVar11 + 1;
  goto LAB_00551fcf;
LAB_00552164:
  lVar13 = lVar13 + 1;
  goto LAB_00552060;
}

Assistant:

double ON_NurbsSurface::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4][4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if ( ThisIsNullptr(false) )
    return failed_rc;
  if (this->m_order[0] < 2 || this->m_order[1] < 2)
    return failed_rc;
  if (this->m_cv_count[0] < this->m_order[0] || this->m_cv_count[0] > 64)
    return failed_rc;
  if (this->m_cv_count[1] < this->m_order[1] || this->m_cv_count[1] > 64)
    return failed_rc;

  ON_3dPoint Q[4];
  
  const ON_Interval domain[2] = { this->Domain(0),this->Domain(1) };
  
  const double c[4] = { domain[1][0],domain[0][1],domain[1][1],domain[0][0] };
  const double maximum_deviation = ON_DBL_QNAN;
  double deviation = 0.0;
  for (int side = 0; side < 4; side++)
  {
    ON_Curve* iso = this->IsoCurve((side%2), c[side]);
    if (nullptr == iso)
      return failed_rc;
    const ON_NurbsCurve* nurbs_curve = ON_NurbsCurve::Cast(iso);
    double d
      = (nullptr != nurbs_curve)
      ? nurbs_curve->GetCubicBezierApproximation(
        maximum_deviation,
        (0 == (side % 2)) ? Q : &bezCV[(1 == side) ? 3 : 0][0])
      : ON_DBL_QNAN;
    if (false == (d >= 0.0))
      return failed_rc;
    if (d > deviation)
      deviation = d;
    if (0 == (side % 2))
    {
      int j = (0 == side) ? 0 : 3;
      bezCV[1][j] = Q[1];
      bezCV[2][j] = Q[2];
    }
    delete iso;
  }

  bezCV[1][1] = ON_3dPoint::Origin;
  bezCV[1][2] = ON_3dPoint::Origin;
  bezCV[2][1] = ON_3dPoint::Origin;
  bezCV[2][2] = ON_3dPoint::Origin;

  ON_BezierSurface bezS;
  bezS.m_dim = 3;
  bezS.m_is_rat = 0;
  bezS.m_order[0] = 4;
  bezS.m_order[1] = 4;
  bezS.m_cv_stride[0] = (int)(&bezCV[1][0].x - &bezCV[0][0].x);
  bezS.m_cv_stride[1] = (int)(&bezCV[0][1].x - &bezCV[0][0].x);
  bezS.m_cv = &bezCV[0][0].x;


  // b[0][] = 27*(bernstein cubics at 1/3)
  // b[1][] = 27*(bernstein cubics at 2/3)
  const double b[2][4] = {
    { 8.0, 12.0, 6.0, 1.0 },
    { 1.0, 6.0, 12.0, 8.0 } 
  };

  // uv[4] = {{1/3,1/3}, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // K[n] = (27*27)*bezCV(uv[n])
  // P[n] = this(domain.ParameterAt(uv[n]));
  // 36* M * Transpose[C11,C21,C12,C22] = [X0,X1,X2,X3]
  // uv[4] = {{1/3,1/3{, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // X0 = nurbs_srf(1/3,1/3) - K[0]/(27*27)
  // A[4][4] = 4x4 matrix with rows
  // 36*A[0][] = {b1[1]*b1[1], b1[2]*b1[1], b1[1]*b1[2], b1[2]*b1[2] }
  // 36*A[1][] = {b2[1]*b1[1], b2[2]*b1[1], b2[1]*b1[2], b2[2]*b1[2] }
  // 36*A[2][] = {b1[1]*b2[1], b1[2]*b2[1], b1[1]*b2[2], b1[2]*b2[2] }
  // 36*A[3][] = {b2[1]*b2[1], b2[2]*b2[1], b2[1]*b2[2], b2[2]*b2[2] }
  // K[n] + 36*(A[n][0]*C11 + A[n][1]*C21 + A[n][2]*C12 + A[n][3]*C22) = (27*27)P[n]
  // A*Transpose(C11,C21,C12,C22) = Transpose(X[0],X[1],X[2],X[3])
  // X[n] = ((27*27)P[n] - K[n])/36 = 81/4*P[n] - K[n]/36.0
  // Inverse(A) = M/9.
  // Transpose(C11,C21,C12,C22) = M*Transpose(X[0],X[1],X[2],X[3])/9
  // Q[n] = X[n]/9 = 2.25*P[n] - K[n]/324.0
  // bezCV[cvdex[n].i][cvdex[n].i] = M*Transpose(X[0],X[1],X[2],X[3])/9
  const double bezuv[4][2] =
  {
    {(1.0 / 3.0), (1.0 / 3.0)},
    {(2.0 / 3.0), (1.0 / 3.0)},
    {(1.0 / 3.0), (2.0 / 3.0)},
    {(2.0 / 3.0), (2.0 / 3.0)}
  };
  ON_3dPoint srfP[4] = { ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin };
  int hint[2] = {};
  for (int n = 0; n < 4; n++)
  {
    this->Evaluate(domain[0].ParameterAt(bezuv[n][0]),domain[1].ParameterAt(bezuv[n][1]), 0, 3, &srfP[n].x, 0, hint);
    const double* bi = b[n%2];
    const double* bj = b[n/2];
    ON_3dPoint K(0.0, 0.0, 0.0);
    ON_3dPoint valQ(0, 0, 0);
    for (int i = 0; i < 4; i++) for (int j = 0; j < 4; j++)
    {
      if ((1 == i || 2 == i) && (1 == j || 2 == j))
        continue;
      K += (bi[i] * bj[j])*bezCV[i][j];
    }
    Q[n] = (2.25*srfP[n]) - (K/324.0);
  }

  const ON_2dex cvdex[4]{ON_2dex(1,1),ON_2dex(2,1),ON_2dex(1,2),ON_2dex(2,2)};

  ////const double A[4][4] =
  ////{
  ////  {4.0, 2.0, 2.0, 1.0},
  ////  {2.0, 4.0, 1.0, 2.0},
  ////  {2.0, 1.0, 4.0, 2.0},
  ////  {1.0, 2.0, 2.0, 4.0}
  ////};

  const double M[4][4] =
  {
    {4.0,-2.0,-2.0,1.0},
    {-2.0,4.0,1.0,-2.0},
    {-2.0,1.0,4.0,-2.0},
    {1.0,-2.0,-2.0,4.0}
  };

  for (int n = 0; n < 4; n++)
    bezCV[cvdex[n].i][cvdex[n].j] = M[n][0] * Q[0] + M[n][1] * Q[1] + M[n][2] * Q[2] + M[n][3] * Q[3];

  double zero_tol = 0.0;
  for (int n = 0; n < 4; n++)
  {
    ON_3dPoint bezP(0.0, 0.0, 0.0);
    bezS.Evaluate(bezuv[n][0], bezuv[n][1], 0, 3, &bezP.x);
    double d = srfP[n].DistanceTo(bezP);
    zero_tol += d;
  }
  zero_tol = 16.0*zero_tol;

  double g_buffer[64];
  double* g[2];
  g[0] 
    = (m_cv_count[0] + m_cv_count[1] <= 32)
    ? g_buffer 
    : (double*)onmalloc((m_cv_count[0] + m_cv_count[1]) * sizeof(g[0][0]));
  g[1] = g[0] + m_cv_count[0];
  for (int dir = 0; dir < 2; dir++)
  {
    this->GetGrevilleAbcissae(dir, g[dir]);
    if (4 == this->m_order[dir])
    {
      const double* k = this->m_knot[dir];
      if (k[0] < k[2])
      {
        g[dir][0] = k[2];
        g[dir][1] = (2.0*k[2] + k[3]) / 3.0;
      }
      const int cv_count = this->m_cv_count[dir];
      k += (cv_count - this->m_order[dir]);
      if (k[3] < k[5])
      {
        g[dir][cv_count-1] = k[3];
        g[dir][cv_count-2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  }

  ON_3dPoint bezP(ON_3dPoint::Origin), nurbsP(ON_3dPoint::Origin);
  hint[0] = 0;
  hint[1] = 0;
  for (int i = 1; i < this->m_cv_count[0]; i++)
  {
    for (int passi = 0; passi < 2; passi++)
    {
      const double t0 = (0 == passi) ? 0.5*(g[0][i - 1] + g[0][i]) : g[0][i];
      const double s0 = domain[0].NormalizedParameterAt(t0);
      if (false == (s0 > 0.0 && s0 < 1.0))
        continue;
      for (int j = 1; j < this->m_cv_count[1]; j++)
      {
        for (int passj = 0; passj < 2; passj++)
        {
          const double t1 = (0 == passj) ? 0.5*(g[1][j - 1] + g[1][j]) : g[1][j];
          const double s1 = domain[1].NormalizedParameterAt(t1);
          if (false == (s1 > 0.0 && s1 < 1.0))
            continue;
          bezS.Evaluate(s0,s1, 0, 3, &bezP.x);
          this->Evaluate(t0,t1, 0, 3, &nurbsP.x, 0, hint);
          double d = nurbsP.DistanceTo(bezP);
          if (d > zero_tol && d > deviation)
          {
            deviation = d;
            if (max_deviation >= 0.0 && deviation > max_deviation)
              return failed_rc;
          }
        }
      }
    }
  }

  return deviation;
}